

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# power.c
# Opt level: O0

void envy_bios_print_power_unk68(envy_bios *bios,FILE *out,uint mask)

{
  envy_bios_power_unk68 *peVar1;
  int local_2c;
  int i;
  envy_bios_power_unk68 *unk68;
  uint mask_local;
  FILE *out_local;
  envy_bios *bios_local;
  
  peVar1 = &(bios->power).unk68;
  if ((peVar1->offset != 0) && ((mask & 0x400) != 0)) {
    if ((bios->power).unk68.valid == '\0') {
      fprintf((FILE *)out,"Failed to parse VOLTAGE RAIL table at 0x%x, version %x\n",
              (ulong)peVar1->offset,(ulong)(bios->power).unk68.version);
    }
    else {
      fprintf((FILE *)out,"VOLTAGE RAIL table at 0x%x, version %x\n",(ulong)peVar1->offset,
              (ulong)(bios->power).unk68.version);
      envy_bios_dump_hex(bios,out,peVar1->offset,(uint)(bios->power).unk68.hlen,mask);
      if ((mask & 0x80000000) != 0) {
        fprintf((FILE *)out,"\n");
      }
      for (local_2c = 0; local_2c < (int)(uint)(bios->power).unk68.entriesnum;
          local_2c = local_2c + 1) {
        envy_bios_dump_hex(bios,out,(bios->power).unk68.entries[local_2c].offset,
                           (uint)(bios->power).unk68.rlen,mask);
        if ((mask & 0x80000000) != 0) {
          fprintf((FILE *)out,"\n");
        }
      }
      fprintf((FILE *)out,"\n");
    }
  }
  return;
}

Assistant:

void envy_bios_print_power_unk68(struct envy_bios *bios, FILE *out, unsigned mask) {
	struct envy_bios_power_unk68 *unk68 = &bios->power.unk68;
	int i;

	if (!unk68->offset || !(mask & ENVY_BIOS_PRINT_PERF))
		return;
	if (!unk68->valid) {
		fprintf(out, "Failed to parse VOLTAGE RAIL table at 0x%x, version %x\n", unk68->offset, unk68->version);
		return;
	}

	fprintf(out, "VOLTAGE RAIL table at 0x%x, version %x\n", unk68->offset, unk68->version);
	envy_bios_dump_hex(bios, out, unk68->offset, unk68->hlen, mask);
	if (mask & ENVY_BIOS_PRINT_VERBOSE) fprintf(out, "\n");

	for (i = 0; i < unk68->entriesnum; i++) {
		envy_bios_dump_hex(bios, out, unk68->entries[i].offset, unk68->rlen, mask);
		if (mask & ENVY_BIOS_PRINT_VERBOSE) fprintf(out, "\n");
	}

	fprintf(out, "\n");
}